

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

double ON_MeshParameters::ClampMeshDensityValue(double slider_value)

{
  double local_10;
  double slider_value_local;
  
  if ((slider_value < -1.490116119385e-08) || (1.490116119385e-08 < slider_value)) {
    if ((slider_value < 0.4999999850988388) || (0.5000000149011612 < slider_value)) {
      if ((slider_value < 0.9999999850988388) || (1.0000000149011612 < slider_value)) {
        local_10 = slider_value;
        if (slider_value < 0.0 || 1.0 < slider_value) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                     ,0x1c5e,"","Invalid slider_value - defaulting to 0.5");
          local_10 = 0.5;
        }
      }
      else {
        local_10 = 1.0;
      }
    }
    else {
      local_10 = 0.5;
    }
  }
  else {
    local_10 = 0.0;
  }
  return local_10;
}

Assistant:

double ON_MeshParameters::ClampMeshDensityValue(double slider_value)
{
  // Make "fuzzy" values of 0.0, 0.5, and 1.0 exactly 0, 0.5, and 1.0 so
  // siders of various int resolutions and code that uses float instead 
  // of double precision values behaves in the expected way.
  if (slider_value >= -ON_SQRT_EPSILON && slider_value <= ON_SQRT_EPSILON)
    slider_value = 0.0;
  else if (slider_value >= (0.5 - ON_SQRT_EPSILON) && slider_value <= (0.5 + ON_SQRT_EPSILON))
    slider_value = 0.5;
  else if (slider_value >= (1.0 - ON_SQRT_EPSILON) && slider_value <= (1.0 + ON_SQRT_EPSILON))
    slider_value = 1.0;
  else if (false == (slider_value >= 0.0 && slider_value <= 1.0))
  {
    // If you get this error, your user interface code has a bug.
    ON_ERROR("Invalid slider_value - defaulting to 0.5");
    slider_value = 0.5; // invalid input treated as 0.5.
  }

  return slider_value;
}